

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_enc.c
# Opt level: O1

void prc_destroy(jpc_enc_prc_t *prc)

{
  jpc_enc_cblk_t *cblk;
  ulong uVar1;
  
  cblk = prc->cblks;
  if (cblk != (jpc_enc_cblk_t *)0x0) {
    if (prc->numcblks != 0) {
      uVar1 = 0;
      do {
        cblk_destroy(cblk);
        uVar1 = uVar1 + 1;
        cblk = cblk + 1;
      } while (uVar1 < prc->numcblks);
    }
    jas_free(prc->cblks);
    prc->cblks = (jpc_enc_cblk_t *)0x0;
  }
  if (prc->incltree != (jpc_tagtree_t *)0x0) {
    jpc_tagtree_destroy(prc->incltree);
    prc->incltree = (jpc_tagtree_t *)0x0;
  }
  if (prc->nlibtree != (jpc_tagtree_t *)0x0) {
    jpc_tagtree_destroy(prc->nlibtree);
    prc->nlibtree = (jpc_tagtree_t *)0x0;
  }
  if (prc->savincltree != (jpc_tagtree_t *)0x0) {
    jpc_tagtree_destroy(prc->savincltree);
    prc->savincltree = (jpc_tagtree_t *)0x0;
  }
  if (prc->savnlibtree != (jpc_tagtree_t *)0x0) {
    jpc_tagtree_destroy(prc->savnlibtree);
    prc->savnlibtree = (jpc_tagtree_t *)0x0;
  }
  return;
}

Assistant:

static void prc_destroy(jpc_enc_prc_t *prc)
{
	jpc_enc_cblk_t *cblk;
	uint_fast32_t cblkno;

	if (prc->cblks) {
		for (cblkno = 0, cblk = prc->cblks; cblkno < prc->numcblks;
		  ++cblkno, ++cblk) {
			cblk_destroy(cblk);
		}
		jas_free(prc->cblks);
		prc->cblks = NULL;
	}
	if (prc->incltree) {
		jpc_tagtree_destroy(prc->incltree);
		prc->incltree = NULL;
	}
	if (prc->nlibtree) {
		jpc_tagtree_destroy(prc->nlibtree);
		prc->nlibtree = NULL;
	}
	if (prc->savincltree) {
		jpc_tagtree_destroy(prc->savincltree);
		prc->savincltree = NULL;
	}
	if (prc->savnlibtree) {
		jpc_tagtree_destroy(prc->savnlibtree);
		prc->savnlibtree = NULL;
	}
}